

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputInfo.hpp
# Opt level: O0

void __thiscall
helics::InputInfo::sourceInformation::sourceInformation
          (sourceInformation *this,string_view key_,string_view type_,string_view units_)

{
  allocator<char> *in_RDI;
  basic_string_view<char,_std::char_traits<char>_> *__t;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  basic_string_view<char,_std::char_traits<char>_> local_29 [2];
  
  __t = local_29;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (in_stack_ffffffffffffffc0,__t,in_RDI);
  std::allocator<char>::~allocator((allocator<char> *)local_29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (in_stack_ffffffffffffffc0,__t,in_RDI);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffc3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (in_stack_ffffffffffffffc0,__t,in_RDI);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffc2);
  return;
}

Assistant:

sourceInformation(std::string_view key_, std::string_view type_, std::string_view units_):
            key(key_), type(type_), units(units_)
        {
        }